

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_find_face(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_face,REF_BOOL *reversed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_INT *pRVar5;
  ulong uVar6;
  REF_BOOL RVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  *found_face = -1;
  uVar6 = 0;
  uVar8 = (ulong)(uint)ref_cavity->maxface;
  if (ref_cavity->maxface < 1) {
    uVar8 = uVar6;
  }
  lVar9 = 8;
  RVar7 = 1;
  while( true ) {
    if (uVar8 == uVar6) {
      return 5;
    }
    pRVar5 = ref_cavity->f2n;
    iVar1 = *(int *)((long)pRVar5 + lVar9 + -8);
    if (iVar1 != -1) break;
LAB_0018d90f:
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 0xc;
  }
  iVar2 = *nodes;
  iVar3 = nodes[1];
  if (iVar2 == iVar1) {
    iVar10 = nodes[2];
    if ((iVar3 != *(int *)((long)pRVar5 + lVar9 + -4)) || (iVar10 != *(int *)((long)pRVar5 + lVar9))
       ) goto LAB_0018d8b9;
  }
  else {
    iVar10 = nodes[2];
LAB_0018d8b9:
    if ((iVar3 != iVar1) ||
       ((iVar10 != *(int *)((long)pRVar5 + lVar9 + -4) || (iVar2 != *(int *)((long)pRVar5 + lVar9)))
       )) {
      if (iVar10 == iVar1) {
        iVar4 = *(int *)((long)pRVar5 + lVar9 + -4);
        if ((iVar2 == iVar4) && (iVar3 == *(int *)((long)pRVar5 + lVar9))) goto LAB_0018d91b;
        if ((iVar3 == iVar4) && (iVar2 == *(int *)((long)pRVar5 + lVar9))) goto LAB_0018d91e;
      }
      if ((((iVar3 == iVar1) && (iVar2 == *(int *)((long)pRVar5 + lVar9 + -4))) &&
          (iVar10 == *(int *)((long)pRVar5 + lVar9))) ||
         (((iVar2 == iVar1 && (iVar10 == *(int *)((long)pRVar5 + lVar9 + -4))) &&
          (iVar3 == *(int *)((long)pRVar5 + lVar9))))) goto LAB_0018d91e;
      goto LAB_0018d90f;
    }
  }
LAB_0018d91b:
  RVar7 = 0;
LAB_0018d91e:
  *found_face = (REF_INT)uVar6;
  *reversed = RVar7;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_face(REF_CAVITY ref_cavity, REF_INT *nodes,
                                        REF_INT *found_face,
                                        REF_BOOL *reversed) {
  REF_INT face;

  *found_face = REF_EMPTY;

  each_ref_cavity_valid_face(ref_cavity, face) {
    if ((nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[2] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[1] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[0] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 2, face)) ||
        (nodes[0] == ref_cavity_f2n(ref_cavity, 0, face) &&
         nodes[2] == ref_cavity_f2n(ref_cavity, 1, face) &&
         nodes[1] == ref_cavity_f2n(ref_cavity, 2, face))) {
      *found_face = face;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}